

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryReader::readMemories(WasmBinaryReader *this)

{
  __node_base_ptr *prefix;
  char *pcVar1;
  size_t sVar2;
  WasmBinaryReader *pWVar3;
  ostream *poVar4;
  _Hash_node_base *p_Var5;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var6;
  Name NVar7;
  Name name;
  size_t *usedNames_00;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  wasm *local_70;
  pair<wasm::Name,_bool> local_68;
  long local_50;
  WasmBinaryReader *local_48;
  _Head_base<0UL,_wasm::Memory_*,_false> local_40;
  __single_object memory;
  
  _Var6._M_head_impl._0_4_ = getU32LEB(this);
  local_50 = (long)(this->wasm->memories).
                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->wasm->memories).
                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  usedNames_00 = &usedNames._M_h._M_rehash_policy._M_next_resize;
  usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedNames._M_h._M_bucket_count = 0;
  usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedNames._M_h._M_rehash_policy._4_4_ = 0;
  usedNames._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var5 = (this->memoryNames)._M_h._M_before_begin._M_nxt;
  _Var6._M_head_impl._4_4_ = 0;
  local_48 = this;
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       _Var6._M_head_impl;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    pcVar1 = (char *)(local_50 + (long)_Var6._M_head_impl);
    do {
      if (pcVar1 <= (char *)(ulong)*(uint *)&p_Var5[1]._M_nxt) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning: memory index out of bounds in name section: ",
                   0x35);
        NVar7.super_IString.str._M_str = (char *)_Var6._M_head_impl;
        NVar7.super_IString.str._M_len = (size_t)p_Var5[3]._M_nxt;
        poVar4 = wasm::operator<<((wasm *)&std::cerr,(ostream *)p_Var5[2]._M_nxt,NVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," at index ",10);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        local_68.first.super_IString.str._M_len =
             CONCAT71(local_68.first.super_IString.str._M_len._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_68,1);
      }
      local_68.first.super_IString.str._M_len = (size_t)&stack0xffffffffffffff38;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&stack0xffffffffffffff38,p_Var5 + 2,&local_68);
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  if ((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)
      memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0) {
    local_70 = (wasm *)&local_48->memoryNames;
    _Var6._M_head_impl = (Memory *)0x0;
    prefix = &usedNames._M_h._M_single_bucket;
    do {
      usedNames._M_h._M_single_bucket = (__node_base_ptr)&local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)prefix,"");
      NVar7 = makeName((string *)prefix,(size_t)_Var6._M_head_impl);
      name.super_IString.str._M_str = &stack0xffffffffffffff38;
      name.super_IString.str._M_len = (size_t)NVar7.super_IString.str._M_str;
      getOrMakeName(&local_68,local_70,
                    (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                     *)(local_50 + (long)_Var6._M_head_impl),(Index)NVar7.super_IString.str._M_len,
                    name,(unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)usedNames_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedNames._M_h._M_single_bucket != &local_80) {
        operator_delete(usedNames._M_h._M_single_bucket,local_80._M_allocated_capacity + 1);
      }
      pcVar1 = local_68.first.super_IString.str._M_str;
      sVar2 = local_68.first.super_IString.str._M_len;
      local_40._M_head_impl = (Memory *)operator_new(0x58);
      pWVar3 = local_48;
      ((local_40._M_head_impl)->max).addr = 0;
      *(undefined8 *)&(local_40._M_head_impl)->shared = 0;
      ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_40._M_head_impl)->initial).addr = 0;
      ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&((local_40._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = sVar2;
      ((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str = pcVar1
      ;
      ((local_40._M_head_impl)->max).addr = 0x10000;
      ((local_40._M_head_impl)->addressType).id = 2;
      ((local_40._M_head_impl)->super_Importable).super_Named.hasExplicitName = local_68.second;
      getResizableLimits(local_48,&(local_40._M_head_impl)->initial,&(local_40._M_head_impl)->max,
                         &(local_40._M_head_impl)->shared,&(local_40._M_head_impl)->addressType,
                         (Address)0xffffffffffffffff);
      Module::addMemory(pWVar3->wasm,
                        (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_40);
      if (local_40._M_head_impl != (Memory *)0x0) {
        operator_delete(local_40._M_head_impl,0x58);
      }
      _Var6._M_head_impl = _Var6._M_head_impl + 1;
    } while (memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl !=
             (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
             _Var6._M_head_impl);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&stack0xffffffffffffff38);
  return;
}

Assistant:

void WasmBinaryReader::readMemories() {
  auto num = getU32LEB();
  auto numImports = wasm.memories.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : memoryNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: memory index out of bounds in name section: "
                << name << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    auto [name, isExplicit] =
      getOrMakeName(memoryNames, numImports + i, makeName("", i), usedNames);
    auto memory = Builder::makeMemory(name);
    memory->hasExplicitName = isExplicit;
    getResizableLimits(memory->initial,
                       memory->max,
                       memory->shared,
                       memory->addressType,
                       Memory::kUnlimitedSize);
    wasm.addMemory(std::move(memory));
  }
}